

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  int iVar1;
  ImDrawList *pIVar2;
  ImDrawVert *pIVar3;
  uint *__src;
  ImVec2 IVar4;
  int iVar5;
  uint uVar6;
  ImDrawVert *pIVar7;
  ulong uVar8;
  uint *__dest;
  ulong uVar9;
  int rhs_size;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ImDrawVert *local_60;
  
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  iVar5 = this->CmdListsCount;
  if (0 < iVar5) {
    iVar1 = 0;
    local_60 = (ImDrawVert *)0x0;
    uVar11 = 0;
    lVar12 = 0;
    do {
      pIVar2 = this->CmdLists[lVar12];
      uVar10 = (pIVar2->IdxBuffer).Size;
      if (uVar10 != 0) {
        uVar6 = uVar10;
        if ((int)uVar11 < (int)uVar10) {
          if (uVar11 == 0) {
            uVar11 = 8;
          }
          else {
            uVar11 = uVar11 + (int)uVar11 / 2;
          }
          if ((int)uVar11 <= (int)uVar10) {
            uVar11 = uVar10;
          }
          pIVar7 = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar11 * 0x14);
          if (local_60 != (ImDrawVert *)0x0) {
            memcpy(pIVar7,local_60,(long)iVar1 * 0x14);
            ImGui::MemFree(local_60);
          }
          local_60 = pIVar7;
          uVar6 = (pIVar2->IdxBuffer).Size;
        }
        if (0 < (int)uVar6) {
          uVar8 = 0;
          if (0 < (int)uVar10) {
            uVar8 = (ulong)uVar10;
          }
          uVar9 = 0;
          pIVar7 = local_60;
          do {
            uVar6 = (pIVar2->IdxBuffer).Data[uVar9];
            if (((pIVar2->VtxBuffer).Size <= (int)uVar6) || (uVar8 == uVar9)) {
              __assert_fail("i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                            ,0x52e,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]");
            }
            pIVar3 = (pIVar2->VtxBuffer).Data;
            pIVar7->col = pIVar3[(int)uVar6].col;
            pIVar3 = pIVar3 + (int)uVar6;
            IVar4 = pIVar3->uv;
            pIVar7->pos = pIVar3->pos;
            pIVar7->uv = IVar4;
            uVar9 = uVar9 + 1;
            pIVar7 = pIVar7 + 1;
          } while ((long)uVar9 < (long)(pIVar2->IdxBuffer).Size);
        }
        iVar1 = (pIVar2->VtxBuffer).Size;
        (pIVar2->VtxBuffer).Size = uVar10;
        uVar6 = (pIVar2->VtxBuffer).Capacity;
        (pIVar2->VtxBuffer).Capacity = uVar11;
        pIVar7 = (pIVar2->VtxBuffer).Data;
        (pIVar2->VtxBuffer).Data = local_60;
        if ((pIVar2->IdxBuffer).Capacity < 0) {
          __dest = (uint *)ImGui::MemAlloc(0);
          __src = (pIVar2->IdxBuffer).Data;
          if (__src != (uint *)0x0) {
            memcpy(__dest,__src,(long)(pIVar2->IdxBuffer).Size << 2);
            ImGui::MemFree((pIVar2->IdxBuffer).Data);
          }
          (pIVar2->IdxBuffer).Data = __dest;
          (pIVar2->IdxBuffer).Capacity = 0;
          uVar10 = (pIVar2->VtxBuffer).Size;
        }
        (pIVar2->IdxBuffer).Size = 0;
        this->TotalVtxCount = this->TotalVtxCount + uVar10;
        iVar5 = this->CmdListsCount;
        uVar11 = uVar6;
        local_60 = pIVar7;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar5);
    if (local_60 != (ImDrawVert *)0x0) {
      ImGui::MemFree(local_60);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}